

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O3

CType * lj_ctype_getfieldq(CTState *cts,CType *ct,GCstr *name,CTSize *ofs,CTInfo *qual)

{
  CType *pCVar1;
  ushort uVar2;
  CTSize CVar3;
  CType *pCVar4;
  
  uVar2 = ct->sib;
  if (uVar2 != 0) {
    pCVar1 = cts->tab;
    do {
      pCVar4 = pCVar1 + uVar2;
      if ((GCstr *)(pCVar4->name).gcptr64 == name) {
        CVar3 = pCVar4->size;
LAB_00148853:
        *ofs = CVar3;
        return pCVar4;
      }
      if ((pCVar4->info & 0xf0ff0000) == 0x80030000) {
        pCVar1 = lj_ctype_getfieldq(cts,pCVar1 + (pCVar4->info & 0xffff),name,ofs,qual);
        if (pCVar1 != (CType *)0x0) {
          if (qual != (CTInfo *)0x0) {
            *qual = *qual;
          }
          CVar3 = *ofs + pCVar4->size;
          pCVar4 = pCVar1;
          goto LAB_00148853;
        }
        pCVar1 = cts->tab;
      }
      uVar2 = pCVar4->sib;
    } while (uVar2 != 0);
  }
  return (CType *)0x0;
}

Assistant:

CType *lj_ctype_getfieldq(CTState *cts, CType *ct, GCstr *name, CTSize *ofs,
			  CTInfo *qual)
{
  while (ct->sib) {
    ct = ctype_get(cts, ct->sib);
    if (gcref(ct->name) == obj2gco(name)) {
      *ofs = ct->size;
      return ct;
    }
    if (ctype_isxattrib(ct->info, CTA_SUBTYPE)) {
      CType *fct, *cct = ctype_child(cts, ct);
      CTInfo q = 0;
      while (ctype_isattrib(cct->info)) {
	if (ctype_attrib(cct->info) == CTA_QUAL) q |= cct->size;
	cct = ctype_child(cts, cct);
      }
      fct = lj_ctype_getfieldq(cts, cct, name, ofs, qual);
      if (fct) {
	if (qual) *qual |= q;
	*ofs += ct->size;
	return fct;
      }
    }
  }
  return NULL;  /* Not found. */
}